

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChQuaternion.cpp
# Opt level: O1

ChQuaternion<double> *
chrono::Qdt_from_AngAxis
          (ChQuaternion<double> *__return_storage_ptr__,ChQuaternion<double> *quat,double angle_dt,
          ChVector<double> *axis)

{
  ChVector<double> W;
  ChVector<double> local_28;
  
  local_28.m_data[0] = angle_dt * axis->m_data[0];
  local_28.m_data[1] = angle_dt * axis->m_data[1];
  local_28.m_data[2] = angle_dt * axis->m_data[2];
  Qdt_from_Wabs(__return_storage_ptr__,&local_28,quat);
  return __return_storage_ptr__;
}

Assistant:

ChQuaternion<double> Qdt_from_AngAxis(const ChQuaternion<double>& quat, double angle_dt, const ChVector<double>& axis) {
    ChVector<double> W;

    W = Vmul(axis, angle_dt);

    return Qdt_from_Wabs(W, quat);
}